

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

Literal * __thiscall wasm::Literal::convertUIToF32(Literal *__return_storage_ptr__,Literal *this)

{
  uintptr_t uVar1;
  ulong uVar2;
  float fVar3;
  
  uVar1 = (this->type).id;
  if (uVar1 == 3) {
    uVar2 = (this->field_0).i64;
    if ((long)uVar2 < 0) {
      fVar3 = (float)uVar2;
      goto LAB_00c950e0;
    }
  }
  else {
    if (uVar1 != 2) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm/literal.cpp"
                         ,0x34b);
    }
    uVar2 = (ulong)(uint)(this->field_0).i32;
  }
  fVar3 = (float)(long)uVar2;
LAB_00c950e0:
  *(float *)&__return_storage_ptr__->field_0 = fVar3;
  (__return_storage_ptr__->type).id = 4;
  return __return_storage_ptr__;
}

Assistant:

bool operator==(const BasicType& other) const { return id == other; }